

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int select_smallest_max_connected_cell(saucy *s,int start,int end)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int *__ptr;
  int iVar4;
  int n;
  int iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  n = s->n;
  __ptr = zeros(n);
  piVar2 = (s->left).clen;
  iVar4 = start + -1;
  piVar6 = piVar2 + start;
  do {
    iVar4 = iVar4 + 1;
    iVar11 = *piVar6;
    piVar6 = piVar6 + 1;
  } while (iVar11 == 0);
  iVar11 = -1;
  iVar5 = -1;
  for (; iVar4 < end; iVar4 = s->nextnon[iVar4]) {
    iVar1 = piVar2[iVar4];
    if (iVar1 <= n) {
      lVar8 = (long)(s->left).lab[iVar4];
      lVar10 = (long)s->depAdj[lVar8 + 1];
      iVar7 = 0;
      lVar9 = (long)s->depAdj[lVar8];
      for (lVar8 = lVar9; lVar8 < lVar10; lVar8 = lVar8 + 1) {
        if (__ptr[s->depEdg[lVar8]] == 0) {
          iVar7 = iVar7 + 1;
          __ptr[s->depEdg[lVar8]] = 1;
        }
      }
      bVar3 = iVar1 < n;
      if (iVar5 < iVar7 || bVar3) {
        n = iVar1;
      }
      for (; lVar9 < lVar10; lVar9 = lVar9 + 1) {
        __ptr[s->depEdg[lVar9]] = 0;
      }
      if (iVar5 < iVar7 || bVar3) {
        iVar5 = iVar7;
        iVar11 = iVar4;
      }
    }
  }
  free(__ptr);
  return iVar11;
}

Assistant:

static int
select_smallest_max_connected_cell(struct saucy *s, int start, int end)
{
    int smallest_cell = -1, cell;
    int smallest_cell_size = s->n;
    int max_connections = -1;
    int * connection_list = zeros(s->n);
    
    cell = start;
    while( !s->left.clen[cell] ) cell++;
    while( cell < end ) {       
        if (s->left.clen[cell] <= smallest_cell_size) {
            int i, connections = 0;;
            for (i = s->depAdj[s->left.lab[cell]]; i < s->depAdj[s->left.lab[cell]+1]; i++) {
                if (!connection_list[s->depEdg[i]]) {
                    connections++;
                    connection_list[s->depEdg[i]] = 1;
                }
            }
            if ((s->left.clen[cell] < smallest_cell_size) || (connections > max_connections)) {
                smallest_cell_size = s->left.clen[cell];
                max_connections = connections;
                smallest_cell = cell;
            }
            for (i = s->depAdj[s->left.lab[cell]]; i < s->depAdj[s->left.lab[cell]+1]; i++)
                connection_list[s->depEdg[i]] = 0;
        }
        cell = s->nextnon[cell];
    }
    
    ABC_FREE( connection_list );
    return smallest_cell;
}